

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.cpp
# Opt level: O2

void libtorrent::aux::expand_unspecified_address
               (span<const_libtorrent::aux::ip_interface> ifs,
               span<const_libtorrent::aux::ip_route> routes,
               vector<libtorrent::aux::listen_endpoint_t,_std::allocator<libtorrent::aux::listen_endpoint_t>_>
               *eps)

{
  anon_enum_32 aVar1;
  listen_endpoint_t *plVar2;
  bool bVar3;
  byte bVar4;
  int fam;
  size_t sVar5;
  difference_type extraout_RDX;
  __normal_iterator<libtorrent::aux::listen_endpoint_t_*,_std::vector<libtorrent::aux::listen_endpoint_t,_std::allocator<libtorrent::aux::listen_endpoint_t>_>_>
  _Var6;
  long lVar7;
  ip_interface *__begin3;
  pointer plVar8;
  ip_interface *this;
  __normal_iterator<libtorrent::aux::listen_endpoint_t_*,_std::vector<libtorrent::aux::listen_endpoint_t,_std::allocator<libtorrent::aux::listen_endpoint_t>_>_>
  _Var9;
  long lVar10;
  span<const_libtorrent::aux::ip_route> routes_00;
  string_view device;
  ip_interface *local_70;
  pointer local_68;
  pointer local_60;
  transport *local_58;
  int *local_50;
  vector<libtorrent::aux::listen_endpoint_t,_std::allocator<libtorrent::aux::listen_endpoint_t>_>
  unspecified_eps;
  
  plVar8 = (eps->
           super__Vector_base<libtorrent::aux::listen_endpoint_t,_std::allocator<libtorrent::aux::listen_endpoint_t>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (_Var6._M_current =
            (eps->
            super__Vector_base<libtorrent::aux::listen_endpoint_t,_std::allocator<libtorrent::aux::listen_endpoint_t>_>
            )._M_impl.super__Vector_impl_data._M_start; _Var6._M_current != plVar8;
      _Var6._M_current = _Var6._M_current + 1) {
    bVar3 = boost::asio::ip::address::is_unspecified(&(_Var6._M_current)->addr);
    if (bVar3) {
      do {
        plVar8 = plVar8 + -1;
        if (plVar8 == _Var6._M_current) goto LAB_00287b69;
        bVar3 = boost::asio::ip::address::is_unspecified(&plVar8->addr);
      } while (bVar3);
      ::std::swap<libtorrent::aux::listen_endpoint_t>(_Var6._M_current,plVar8);
    }
  }
LAB_00287b69:
  ::std::
  vector<libtorrent::aux::listen_endpoint_t,std::allocator<libtorrent::aux::listen_endpoint_t>>::
  vector<__gnu_cxx::__normal_iterator<libtorrent::aux::listen_endpoint_t*,std::vector<libtorrent::aux::listen_endpoint_t,std::allocator<libtorrent::aux::listen_endpoint_t>>>,void>
            ((vector<libtorrent::aux::listen_endpoint_t,std::allocator<libtorrent::aux::listen_endpoint_t>>
              *)&unspecified_eps,_Var6,
             (eps->
             super__Vector_base<libtorrent::aux::listen_endpoint_t,_std::allocator<libtorrent::aux::listen_endpoint_t>_>
             )._M_impl.super__Vector_impl_data._M_finish,(allocator_type *)&local_70);
  ::std::
  vector<libtorrent::aux::listen_endpoint_t,_std::allocator<libtorrent::aux::listen_endpoint_t>_>::
  erase(eps,(const_iterator)_Var6._M_current,
        (eps->
        super__Vector_base<libtorrent::aux::listen_endpoint_t,_std::allocator<libtorrent::aux::listen_endpoint_t>_>
        )._M_impl.super__Vector_impl_data._M_finish);
  local_60 = unspecified_eps.
             super__Vector_base<libtorrent::aux::listen_endpoint_t,_std::allocator<libtorrent::aux::listen_endpoint_t>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  plVar8 = unspecified_eps.
           super__Vector_base<libtorrent::aux::listen_endpoint_t,_std::allocator<libtorrent::aux::listen_endpoint_t>_>
           ._M_impl.super__Vector_impl_data._M_start;
  do {
    if (plVar8 == local_60) {
      ::std::
      vector<libtorrent::aux::listen_endpoint_t,_std::allocator<libtorrent::aux::listen_endpoint_t>_>
      ::~vector(&unspecified_eps);
      return;
    }
    aVar1 = (plVar8->addr).type_;
    local_50 = &plVar8->port;
    local_58 = &plVar8->ssl;
    for (this = ifs.m_ptr; this != ifs.m_ptr + ifs.m_len; this = this + 1) {
      if (((this->preferred == true) &&
          (((this->interface_address).type_ == ipv4) == (aVar1 == ipv4))) &&
         (((plVar8->device)._M_string_length == 0 ||
          (bVar3 = ::std::operator!=(&plVar8->device,this->name), !bVar3)))) {
        _Var6._M_current =
             (eps->
             super__Vector_base<libtorrent::aux::listen_endpoint_t,_std::allocator<libtorrent::aux::listen_endpoint_t>_>
             )._M_impl.super__Vector_impl_data._M_start;
        plVar2 = (eps->
                 super__Vector_base<libtorrent::aux::listen_endpoint_t,_std::allocator<libtorrent::aux::listen_endpoint_t>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
        lVar10 = (long)plVar2 - (long)_Var6._M_current;
        local_70 = this;
        local_68 = plVar8;
        for (lVar7 = lVar10 / 0x70 >> 2; _Var9._M_current = _Var6._M_current, 0 < lVar7;
            lVar7 = lVar7 + -1) {
          bVar3 = __gnu_cxx::__ops::
                  _Iter_pred<libtorrent::aux::expand_unspecified_address(libtorrent::span<libtorrent::aux::ip_interface_const>,libtorrent::span<libtorrent::aux::ip_route_const>,std::vector<libtorrent::aux::listen_endpoint_t,std::allocator<libtorrent::aux::listen_endpoint_t>>&)::$_1>
                  ::operator()((_Iter_pred<libtorrent::aux::expand_unspecified_address(libtorrent::span<libtorrent::aux::ip_interface_const>,libtorrent::span<libtorrent::aux::ip_route_const>,std::vector<libtorrent::aux::listen_endpoint_t,std::allocator<libtorrent::aux::listen_endpoint_t>>&)::__1>
                                *)&local_70,_Var6);
          if (bVar3) goto LAB_00287d48;
          bVar3 = __gnu_cxx::__ops::
                  _Iter_pred<libtorrent::aux::expand_unspecified_address(libtorrent::span<libtorrent::aux::ip_interface_const>,libtorrent::span<libtorrent::aux::ip_route_const>,std::vector<libtorrent::aux::listen_endpoint_t,std::allocator<libtorrent::aux::listen_endpoint_t>>&)::$_1>
                  ::operator()((_Iter_pred<libtorrent::aux::expand_unspecified_address(libtorrent::span<libtorrent::aux::ip_interface_const>,libtorrent::span<libtorrent::aux::ip_route_const>,std::vector<libtorrent::aux::listen_endpoint_t,std::allocator<libtorrent::aux::listen_endpoint_t>>&)::__1>
                                *)&local_70,_Var6._M_current + 1);
          _Var9._M_current = _Var6._M_current + 1;
          if (bVar3) goto LAB_00287d48;
          bVar3 = __gnu_cxx::__ops::
                  _Iter_pred<libtorrent::aux::expand_unspecified_address(libtorrent::span<libtorrent::aux::ip_interface_const>,libtorrent::span<libtorrent::aux::ip_route_const>,std::vector<libtorrent::aux::listen_endpoint_t,std::allocator<libtorrent::aux::listen_endpoint_t>>&)::$_1>
                  ::operator()((_Iter_pred<libtorrent::aux::expand_unspecified_address(libtorrent::span<libtorrent::aux::ip_interface_const>,libtorrent::span<libtorrent::aux::ip_route_const>,std::vector<libtorrent::aux::listen_endpoint_t,std::allocator<libtorrent::aux::listen_endpoint_t>>&)::__1>
                                *)&local_70,_Var6._M_current + 2);
          _Var9._M_current = _Var6._M_current + 2;
          if (bVar3) goto LAB_00287d48;
          bVar3 = __gnu_cxx::__ops::
                  _Iter_pred<libtorrent::aux::expand_unspecified_address(libtorrent::span<libtorrent::aux::ip_interface_const>,libtorrent::span<libtorrent::aux::ip_route_const>,std::vector<libtorrent::aux::listen_endpoint_t,std::allocator<libtorrent::aux::listen_endpoint_t>>&)::$_1>
                  ::operator()((_Iter_pred<libtorrent::aux::expand_unspecified_address(libtorrent::span<libtorrent::aux::ip_interface_const>,libtorrent::span<libtorrent::aux::ip_route_const>,std::vector<libtorrent::aux::listen_endpoint_t,std::allocator<libtorrent::aux::listen_endpoint_t>>&)::__1>
                                *)&local_70,_Var6._M_current + 3);
          _Var9._M_current = _Var6._M_current + 3;
          if (bVar3) goto LAB_00287d48;
          _Var6._M_current = _Var6._M_current + 4;
          lVar10 = lVar10 + -0x1c0;
        }
        lVar10 = lVar10 / 0x70;
        if (lVar10 == 1) {
LAB_00287e48:
          bVar3 = __gnu_cxx::__ops::
                  _Iter_pred<libtorrent::aux::expand_unspecified_address(libtorrent::span<libtorrent::aux::ip_interface_const>,libtorrent::span<libtorrent::aux::ip_route_const>,std::vector<libtorrent::aux::listen_endpoint_t,std::allocator<libtorrent::aux::listen_endpoint_t>>&)::$_1>
                  ::operator()((_Iter_pred<libtorrent::aux::expand_unspecified_address(libtorrent::span<libtorrent::aux::ip_interface_const>,libtorrent::span<libtorrent::aux::ip_route_const>,std::vector<libtorrent::aux::listen_endpoint_t,std::allocator<libtorrent::aux::listen_endpoint_t>>&)::__1>
                                *)&local_70,_Var6);
          _Var9._M_current = _Var6._M_current;
          if (!bVar3) {
            _Var9._M_current = plVar2;
          }
LAB_00287d48:
          if (_Var9._M_current != plVar2) goto LAB_00287d4d;
        }
        else {
          if (lVar10 == 2) {
LAB_00287d1f:
            bVar3 = __gnu_cxx::__ops::
                    _Iter_pred<libtorrent::aux::expand_unspecified_address(libtorrent::span<libtorrent::aux::ip_interface_const>,libtorrent::span<libtorrent::aux::ip_route_const>,std::vector<libtorrent::aux::listen_endpoint_t,std::allocator<libtorrent::aux::listen_endpoint_t>>&)::$_1>
                    ::operator()((_Iter_pred<libtorrent::aux::expand_unspecified_address(libtorrent::span<libtorrent::aux::ip_interface_const>,libtorrent::span<libtorrent::aux::ip_route_const>,std::vector<libtorrent::aux::listen_endpoint_t,std::allocator<libtorrent::aux::listen_endpoint_t>>&)::__1>
                                  *)&local_70,_Var6);
            _Var9._M_current = _Var6._M_current;
            if (!bVar3) {
              _Var6._M_current = _Var6._M_current + 1;
              goto LAB_00287e48;
            }
            goto LAB_00287d48;
          }
          if (lVar10 == 3) {
            bVar3 = __gnu_cxx::__ops::
                    _Iter_pred<libtorrent::aux::expand_unspecified_address(libtorrent::span<libtorrent::aux::ip_interface_const>,libtorrent::span<libtorrent::aux::ip_route_const>,std::vector<libtorrent::aux::listen_endpoint_t,std::allocator<libtorrent::aux::listen_endpoint_t>>&)::$_1>
                    ::operator()((_Iter_pred<libtorrent::aux::expand_unspecified_address(libtorrent::span<libtorrent::aux::ip_interface_const>,libtorrent::span<libtorrent::aux::ip_route_const>,std::vector<libtorrent::aux::listen_endpoint_t,std::allocator<libtorrent::aux::listen_endpoint_t>>&)::__1>
                                  *)&local_70,_Var6);
            if (!bVar3) {
              _Var6._M_current = _Var6._M_current + 1;
              goto LAB_00287d1f;
            }
            goto LAB_00287d48;
          }
        }
        if (((this->state == unknown) || (this->state == up)) && (((this->flags).m_val & 1) != 0)) {
          bVar3 = boost::asio::ip::address::is_loopback(&this->interface_address);
          if (((bVar3) || (bVar3 = is_link_local(&this->interface_address), bVar3)) ||
             (((this->flags).m_val & 4) != 0)) {
            bVar4 = 6;
          }
          else {
            bVar3 = is_global(&this->interface_address);
            if (((bVar3) || (((this->flags).m_val & 8) != 0)) ||
               (routes_00.m_len = extraout_RDX, routes_00.m_ptr = (ip_route *)routes.m_len,
               bVar3 = has_any_internet_route((aux *)routes.m_ptr,routes_00), !bVar3)) {
              bVar4 = 4;
            }
            else {
              sVar5 = strlen(this->name);
              fam = family(&this->interface_address);
              device._M_str = this->name;
              device._M_len = sVar5;
              bVar3 = has_internet_route(device,fam,routes);
              bVar4 = !bVar3 * '\x02' | 4;
            }
          }
          local_70 = (ip_interface *)CONCAT71(local_70._1_7_,bVar4 | (plVar8->flags).m_val);
          ::std::
          vector<libtorrent::aux::listen_endpoint_t,std::allocator<libtorrent::aux::listen_endpoint_t>>
          ::
          emplace_back<boost::asio::ip::address_const&,int_const&,std::__cxx11::string_const&,libtorrent::aux::transport_const&,libtorrent::flags::bitfield_flag<unsigned_char,libtorrent::aux::listen_socket_flags_tag,void>>
                    ((vector<libtorrent::aux::listen_endpoint_t,std::allocator<libtorrent::aux::listen_endpoint_t>>
                      *)eps,&this->interface_address,local_50,&plVar8->device,local_58,
                     (bitfield_flag<unsigned_char,_libtorrent::aux::listen_socket_flags_tag,_void> *
                     )&local_70);
        }
      }
LAB_00287d4d:
    }
    plVar8 = plVar8 + 1;
  } while( true );
}

Assistant:

void expand_unspecified_address(span<ip_interface const> const ifs
		, span<ip_route const> const routes
		, std::vector<listen_endpoint_t>& eps)
	{
		auto unspecified_begin = std::partition(eps.begin(), eps.end()
			, [](listen_endpoint_t const& ep) { return !ep.addr.is_unspecified(); });
		std::vector<listen_endpoint_t> unspecified_eps(unspecified_begin, eps.end());
		eps.erase(unspecified_begin, eps.end());
		for (auto const& uep : unspecified_eps)
		{
			bool const v4 = uep.addr.is_v4();
			for (auto const& ipface : ifs)
			{
				if (!ipface.preferred)
					continue;
				if (ipface.interface_address.is_v4() != v4)
					continue;
				if (!uep.device.empty() && uep.device != ipface.name)
					continue;
				if (std::any_of(eps.begin(), eps.end(), [&](listen_endpoint_t const& e)
				{
					// ignore device name because we don't want to create
					// duplicates if the user explicitly configured an address
					// without a device name
					return e.addr == ipface.interface_address
						&& e.port == uep.port
						&& e.ssl == uep.ssl;
				}))
				{
					continue;
				}

				// ignore interfaces that are down
				if (ipface.state != if_state::up && ipface.state != if_state::unknown)
					continue;
				if (!(ipface.flags & if_flags::up))
					continue;

				// we assume this listen_socket_t is local-network under some
				// conditions, meaning we won't announce it to internet trackers
				// if "routes" does not contain a single route to the internet,
				// we don't use the last case. On MacOS, we can be notified of
				// network changes *before* the routing table is updated
				bool const local
					= ipface.interface_address.is_loopback()
					|| is_link_local(ipface.interface_address)
					|| (ipface.flags & if_flags::loopback)
					|| (!is_global(ipface.interface_address)
						&& !(ipface.flags & if_flags::pointopoint)
						&& has_any_internet_route(routes)
						&& !has_internet_route(ipface.name, family(ipface.interface_address), routes));

				eps.emplace_back(ipface.interface_address, uep.port, uep.device
					, uep.ssl, uep.flags | listen_socket_t::was_expanded
					| (local ? listen_socket_t::local_network : listen_socket_flags_t{}));
			}
		}
	}